

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_datatype_string(int dt)

{
  char *pcStack_10;
  int dt_local;
  
  if (dt == 0) {
    pcStack_10 = "UNKNOWN";
  }
  else if (dt == 1) {
    pcStack_10 = "BINARY";
  }
  else if (dt == 2) {
    pcStack_10 = "UINT8";
  }
  else if (dt == 4) {
    pcStack_10 = "INT16";
  }
  else if (dt == 8) {
    pcStack_10 = "INT32";
  }
  else if (dt == 0x10) {
    pcStack_10 = "FLOAT32";
  }
  else if (dt == 0x20) {
    pcStack_10 = "COMPLEX64";
  }
  else if (dt == 0x40) {
    pcStack_10 = "FLOAT64";
  }
  else if (dt == 0x80) {
    pcStack_10 = "RGB24";
  }
  else if (dt == 0x100) {
    pcStack_10 = "INT8";
  }
  else if (dt == 0x200) {
    pcStack_10 = "UINT16";
  }
  else if (dt == 0x300) {
    pcStack_10 = "UINT32";
  }
  else if (dt == 0x400) {
    pcStack_10 = "INT64";
  }
  else if (dt == 0x500) {
    pcStack_10 = "UINT64";
  }
  else if (dt == 0x600) {
    pcStack_10 = "FLOAT128";
  }
  else if (dt == 0x700) {
    pcStack_10 = "COMPLEX128";
  }
  else if (dt == 0x800) {
    pcStack_10 = "COMPLEX256";
  }
  else if (dt == 0x900) {
    pcStack_10 = "RGBA32";
  }
  else {
    pcStack_10 = "**ILLEGAL**";
  }
  return pcStack_10;
}

Assistant:

char const * nifti_datatype_string( int dt )
{
   switch( dt ){
     case DT_UNKNOWN:    return "UNKNOWN"    ;
     case DT_BINARY:     return "BINARY"     ;
     case DT_INT8:       return "INT8"       ;
     case DT_UINT8:      return "UINT8"      ;
     case DT_INT16:      return "INT16"      ;
     case DT_UINT16:     return "UINT16"     ;
     case DT_INT32:      return "INT32"      ;
     case DT_UINT32:     return "UINT32"     ;
     case DT_INT64:      return "INT64"      ;
     case DT_UINT64:     return "UINT64"     ;
     case DT_FLOAT32:    return "FLOAT32"    ;
     case DT_FLOAT64:    return "FLOAT64"    ;
     case DT_FLOAT128:   return "FLOAT128"   ;
     case DT_COMPLEX64:  return "COMPLEX64"  ;
     case DT_COMPLEX128: return "COMPLEX128" ;
     case DT_COMPLEX256: return "COMPLEX256" ;
     case DT_RGB24:      return "RGB24"      ;
     case DT_RGBA32:     return "RGBA32"     ;
   }
   return "**ILLEGAL**" ;
}